

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(VisionFeaturePrint *a,VisionFeaturePrint *b)

{
  uint32 uVar1;
  int iVar2;
  bool bVar3;
  VisionFeaturePrint_Scene *pVVar4;
  VisionFeaturePrint_Objects *pVVar5;
  Type *__lhs;
  Type *__rhs;
  int i;
  int index;
  
  uVar1 = a->_oneof_case_[0];
  if (uVar1 != b->_oneof_case_[0]) {
    return false;
  }
  if (uVar1 == 0x15) {
    pVVar5 = CoreMLModels::VisionFeaturePrint::objects(a);
    iVar2 = pVVar5->version_;
    pVVar5 = CoreMLModels::VisionFeaturePrint::objects(b);
    if (iVar2 != pVVar5->version_) {
      return false;
    }
    pVVar5 = CoreMLModels::VisionFeaturePrint::objects(a);
    iVar2 = (pVVar5->output_).super_RepeatedPtrFieldBase.current_size_;
    pVVar5 = CoreMLModels::VisionFeaturePrint::objects(b);
    index = 0;
    if (iVar2 != (pVVar5->output_).super_RepeatedPtrFieldBase.current_size_) {
      return false;
    }
    while (pVVar5 = CoreMLModels::VisionFeaturePrint::objects(a),
          index < (pVVar5->output_).super_RepeatedPtrFieldBase.current_size_) {
      pVVar5 = CoreMLModels::VisionFeaturePrint::objects(a);
      __lhs = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(pVVar5->output_).super_RepeatedPtrFieldBase,index);
      pVVar5 = CoreMLModels::VisionFeaturePrint::objects(b);
      __rhs = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(pVVar5->output_).super_RepeatedPtrFieldBase,index);
      bVar3 = std::operator!=(__lhs,__rhs);
      index = index + 1;
      if (bVar3) {
        return false;
      }
    }
  }
  else if (uVar1 == 0x14) {
    pVVar4 = CoreMLModels::VisionFeaturePrint::scene(a);
    iVar2 = pVVar4->version_;
    pVVar4 = CoreMLModels::VisionFeaturePrint::scene(b);
    if (iVar2 != pVVar4->version_) {
      return false;
    }
  }
  return true;
}

Assistant:

inline VisionFeaturePrint::VisionFeaturePrintTypeCase VisionFeaturePrint::VisionFeaturePrintType_case() const {
  return VisionFeaturePrint::VisionFeaturePrintTypeCase(_oneof_case_[0]);
}